

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O1

Vector2f Rml::CalculateAutoscrollVelocity(Vector2f target_delta,float dp_ratio)

{
  Vector2f VVar1;
  Vector2f VVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = target_delta.x / dp_ratio;
  fVar3 = target_delta.y / dp_ratio;
  fVar4 = Math::Absolute(fVar5);
  fVar5 = (float)(~-(uint)(fVar4 < 10.0) & (uint)fVar5);
  fVar4 = Math::Absolute(fVar3);
  fVar3 = (float)(~-(uint)(fVar4 < 10.0) & (uint)fVar3);
  VVar2.y = fVar3;
  VVar2.x = fVar5;
  VVar2 = Math::Absolute(VVar2);
  VVar1.y = VVar2.y * fVar3 * 0.09;
  VVar1.x = fVar5 * 0.09 * VVar2.x;
  return VVar1;
}

Assistant:

static Vector2f CalculateAutoscrollVelocity(Vector2f target_delta, float dp_ratio)
{
	target_delta = target_delta / dp_ratio;
	target_delta = {
		Math::Absolute(target_delta.x) < AUTOSCROLL_DEADZONE ? 0.f : target_delta.x,
		Math::Absolute(target_delta.y) < AUTOSCROLL_DEADZONE ? 0.f : target_delta.y,
	};

	// We use a signed square model for the velocity, which seems to work quite well. This is mostly about feeling and tuning.
	return AUTOSCROLL_SPEED_FACTOR * target_delta * Math::Absolute(target_delta);
}